

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObserverManager.h
# Opt level: O1

void __thiscall
ObserverManager::notify<FooBarProtocol,std::__cxx11::string_const&,char_const*>
          (ObserverManager *this,offset_in_FooBarProtocol_to_subr method,char *args)

{
  iterator iVar1;
  __node_base_ptr p_Var2;
  __node_base _Var3;
  long *plVar4;
  unsigned_long *__k;
  pair<FooBarProtocol_*,_unsigned_long> *ppVar5;
  ObserverManager *pOVar6;
  vector<std::pair<FooBarProtocol_*,_unsigned_long>,_std::allocator<std::pair<FooBarProtocol_*,_unsigned_long>_>_>
  observers;
  allocator local_89;
  pair<FooBarProtocol_*,_unsigned_long> *local_88;
  iterator iStack_80;
  pair<FooBarProtocol_*,_unsigned_long> *local_78;
  ObserverManager *local_68;
  pair<FooBarProtocol_*,_unsigned_long> local_60;
  FooBarProtocol local_50;
  offset_in_FooBarProtocol_to_subr local_40;
  char *local_38;
  
  local_88 = (pair<FooBarProtocol_*,_unsigned_long> *)0x0;
  iStack_80._M_current = (pair<FooBarProtocol_*,_unsigned_long> *)0x0;
  local_78 = (pair<FooBarProtocol_*,_unsigned_long> *)0x0;
  local_68 = this;
  local_40 = method;
  local_38 = args;
  if (ObserverContainer<FooBarProtocol>::observers._M_h._M_before_begin._M_nxt !=
      (_Hash_node_base *)0x0) {
    _Var3._M_nxt = ObserverContainer<FooBarProtocol>::observers._M_h._M_before_begin._M_nxt;
    do {
      local_60.first = (FooBarProtocol *)_Var3._M_nxt[1]._M_nxt;
      local_60.second = ((local_60.first)->super_BaseObserverProtocol).observerId;
      if (iStack_80._M_current == local_78) {
        std::
        vector<std::pair<FooBarProtocol*,unsigned_long>,std::allocator<std::pair<FooBarProtocol*,unsigned_long>>>
        ::_M_realloc_insert<std::pair<FooBarProtocol*,unsigned_long>>
                  ((vector<std::pair<FooBarProtocol*,unsigned_long>,std::allocator<std::pair<FooBarProtocol*,unsigned_long>>>
                    *)&local_88,iStack_80,&local_60);
      }
      else {
        (iStack_80._M_current)->first = local_60.first;
        (iStack_80._M_current)->second = local_60.second;
        iStack_80._M_current = iStack_80._M_current + 1;
      }
      _Var3._M_nxt = (_Var3._M_nxt)->_M_nxt;
    } while (_Var3._M_nxt != (_Hash_node_base *)0x0);
  }
  iVar1._M_current = iStack_80._M_current;
  if (local_88 != iStack_80._M_current) {
    __k = &local_88->second;
    do {
      p_Var2 = std::
               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_std::allocator<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         (&unsubscribeMap._M_h,*__k % unsubscribeMap._M_h._M_bucket_count,__k,*__k);
      if ((p_Var2 != (__node_base_ptr)0x0) && (p_Var2->_M_nxt != (_Hash_node_base *)0x0)) {
        plVar4 = (long *)((long)&(((pair<FooBarProtocol_*,_unsigned_long> *)(__k + -1))->first->
                                 super_BaseObserverProtocol)._vptr_BaseObserverProtocol + local_40);
        pOVar6 = local_68;
        if (((ulong)local_68 & 1) != 0) {
          pOVar6 = *(ObserverManager **)(local_68 + *plVar4 + -1);
        }
        std::__cxx11::string::string((string *)&local_60,local_38,&local_89);
        (*(code *)pOVar6)(plVar4,&local_60);
        if (local_60.first != &local_50) {
          operator_delete(local_60.first);
        }
      }
      ppVar5 = (pair<FooBarProtocol_*,_unsigned_long> *)(__k + 1);
      __k = __k + 2;
    } while (ppVar5 != iVar1._M_current);
  }
  if (local_88 != (pair<FooBarProtocol_*,_unsigned_long> *)0x0) {
    operator_delete(local_88);
  }
  return;
}

Assistant:

static void notify(void (P::*method)(MethodArgumentTypes...), ActualArgumentTypes... args) {
        std::vector<std::pair<P*, BaseObserverProtocol::id_t>> observers;
        for (const auto& o : ObserverContainer<P>::observers) {
            observers.push_back(std::make_pair(o, o->observerId));
        }

        for (const auto& p : observers) {
            if (unsubscribeMap.find(p.second) == std::end(unsubscribeMap)) {
                continue;
            }
            (p.first->*method)(args...);
        }
    }